

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O0

void duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>::
     Execute<int,duckdb::hugeint_t,duckdb::ArgMinMaxState<int,duckdb::hugeint_t>>
               (ArgMinMaxState<int,_duckdb::hugeint_t> *state,int x_data,hugeint_t y_data,
               AggregateBinaryInput *binary)

{
  bool bVar1;
  ArgMinMaxState<int,_duckdb::hugeint_t> *in_RDX;
  undefined4 in_ESI;
  hugeint_t *in_RDI;
  TemplatedValidityMask<unsigned_long> *in_R8;
  idx_t in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  
  bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid(in_R8,in_stack_ffffffffffffffd0);
  if ((bVar1) &&
     (bVar1 = GreaterThan::Operation<duckdb::hugeint_t>((hugeint_t *)in_RDX,in_RDI), bVar1)) {
    TemplatedValidityMask<unsigned_long>::RowIsValid(in_R8,(idx_t)in_RDI);
    Assign<int,duckdb::hugeint_t,duckdb::ArgMinMaxState<int,duckdb::hugeint_t>>
              (in_RDX,(int *)in_RDI,(hugeint_t *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0),
               SUB81((ulong)in_R8 >> 0x38,0));
  }
  return;
}

Assistant:

static void Execute(STATE &state, A_TYPE x_data, B_TYPE y_data, AggregateBinaryInput &binary) {
		if ((IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) && COMPARATOR::Operation(y_data, state.value)) {
			Assign(state, x_data, y_data, !binary.left_mask.RowIsValid(binary.lidx));
		}
	}